

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O2

void __thiscall WavFileWriter::~WavFileWriter(WavFileWriter *this)

{
  list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->m_OutFile;
  while ((this_00->super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>)._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
    p_Var1 = (this->m_OutFile).super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
    if (p_Var1 != (_List_node_base *)0x0) {
      (*(code *)p_Var1->_M_next->_M_prev)();
    }
    std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::pop_back(this_00);
  }
  std::__cxx11::_List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>::_M_clear
            (&this_00->super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>);
  return;
}

Assistant:

~WavFileWriter()
    {
      while ( ! m_OutFile.empty() )
	{
	  delete m_OutFile.back();
	  m_OutFile.pop_back();
	}
    }